

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O0

void get_colamd(int m,int n,int_t nnz,int_t *colptr,int_t *rowind,int *perm_c)

{
  int iVar1;
  size_t sVar2;
  int_t *A_00;
  int_t *p_00;
  char local_448 [8];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  int_t stats [20];
  double knobs [20];
  int info;
  int_t *p;
  int_t i;
  int_t *A;
  size_t Alen;
  int *perm_c_local;
  int_t *rowind_local;
  int_t *colptr_local;
  int_t nnz_local;
  int n_local;
  int m_local;
  
  sVar2 = colamd_recommended(nnz,m,n);
  colamd_set_defaults((double *)(stats + 0x12));
  A_00 = intMalloc((int_t)sVar2);
  if (A_00 == (int_t *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for A[]",0x37,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  p_00 = intMalloc(n + 1);
  if (p_00 == (int_t *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Malloc fails for p[]",0x38,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  for (p._4_4_ = 0; p._4_4_ <= n; p._4_4_ = p._4_4_ + 1) {
    p_00[p._4_4_] = colptr[p._4_4_];
  }
  for (p._4_4_ = 0; p._4_4_ < nnz; p._4_4_ = p._4_4_ + 1) {
    A_00[p._4_4_] = rowind[p._4_4_];
  }
  iVar1 = colamd(m,n,(int_t)sVar2,A_00,p_00,(double *)(stats + 0x12),(int *)(msg + 0xf8));
  if (iVar1 == 0) {
    sprintf(local_448,"%s at line %d in file %s\n","COLAMD failed",0x3f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_448);
  }
  for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
    perm_c[p_00[p._4_4_]] = p._4_4_;
  }
  superlu_free(A_00);
  superlu_free(p_00);
  return;
}

Assistant:

void get_colamd(const int m, const int n, const int_t nnz,
                const int_t *colptr, const int_t *rowind, int *perm_c)
{
    size_t Alen;
    int_t *A, i, *p;
    int info;
    double knobs[COLAMD_KNOBS];
    int_t stats[COLAMD_STATS];

    Alen = COLAMD_recommended(nnz, m, n);

    COLAMD_set_defaults(knobs);

    if ( !(A = intMalloc(Alen)) ) ABORT("Malloc fails for A[]");
    if ( !(p = intMalloc(n+1)) )  ABORT("Malloc fails for p[]");
    for (i = 0; i <= n; ++i) p[i] = colptr[i];
    for (i = 0; i < nnz; ++i) A[i] = rowind[i];
    
    info = COLAMD_MAIN(m, n, Alen, A, p, knobs, stats);

    //printf("after COLAMD_MAIN info %d\n", info);
    if ( info == FALSE ) ABORT("COLAMD failed");

    for (i = 0; i < n; ++i) perm_c[p[i]] = i;

    SUPERLU_FREE(A);
    SUPERLU_FREE(p);
}